

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O3

uint ON_VersionNumberConstruct
               (uint major_version,uint minor_version,uint year,uint month,uint day_of_month,
               uint platform_branch)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (year - 2000 < 100) {
    uVar2 = ON_DayOfGregorianYear(year,month,day_of_month);
    if (uVar2 != 0) {
      uVar2 = (year * 0x16f + uVar2) - 0xb3330;
      goto LAB_0066353e;
    }
  }
  uVar2 = 0;
LAB_0066353e:
  uVar3 = ON::VersionMinorMaximum();
  if (uVar3 < minor_version) {
    minor_version = ON::VersionMinorMaximum();
  }
  uVar3 = ON::VersionMajorMaximum();
  if (uVar3 < major_version) {
    major_version = ON::VersionMajorMaximum();
  }
  uVar3 = 2 - (platform_branch & 1);
  if (platform_branch == 0) {
    uVar3 = 0;
  }
  uVar1 = 0xffff;
  if (uVar2 < 0xffff) {
    uVar1 = uVar2;
  }
  uVar2 = ON::VersionMinorMaximum();
  return ((uVar2 + 1) * major_version + minor_version) * 0x40000 + uVar1 * 4 | uVar3 | 0x80000000;
}

Assistant:

unsigned int ON_VersionNumberConstruct(
  unsigned int major_version,
  unsigned int minor_version,
  unsigned int year,
  unsigned int month,
  unsigned int day_of_month,
  unsigned int platform_branch
  )
{
  unsigned int version_number = 0;
  unsigned int version_time = ON_VersionNumberTime(year,month,day_of_month);

  if (version_time > TIME_MAX)
    version_time = TIME_MAX;

  // platform
  //   0 = developer
  //   1 = Windows Commercial/Beta/WIP
  //   2 = Mac OS Commercial/Beta/WIP
  unsigned int platform
    = (platform_branch > 0)
    ? (2 - (platform_branch % 2) )
    : 0;
  if ( platform > BRANCH_MAX )
    platform = 0; // all invalid branch numbers get mapped to "developer"
  if ( minor_version > ON::VersionMinorMaximum())
    minor_version = ON::VersionMinorMaximum();
  if ( major_version > ON::VersionMajorMaximum())
    major_version = ON::VersionMajorMaximum();
  version_number = ((major_version*(ON::VersionMinorMaximum()+1) + minor_version)*(TIME_MAX+1) + version_time)*(BRANCH_MAX+1) + platform;
  version_number |= 0x80000000;
  return version_number;
}